

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

string * __thiscall
absl::lts_20240722::str_format_internal::Summarize_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,UntypedFormatSpecImpl format,
          Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> args)

{
  pointer pCVar1;
  bool bVar2;
  void *pvVar3;
  ParsedFormatBase *pPVar4;
  char *pcVar5;
  int *next_arg_00;
  FormatSinkImpl *pFVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_03;
  size_t sVar7;
  byte *pbVar8;
  ConversionItem *item;
  pointer pCVar9;
  char *pcVar10;
  byte *end;
  char *pcVar11;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view sVar12;
  ConvTag tag;
  int next_arg;
  UnboundConversion conv;
  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  local_4a0;
  string out;
  UntypedFormatSpecImpl local_460;
  FormatSinkImpl sink;
  size_t extraout_RDX_02;
  
  local_460.size_ = (size_t)format.data_;
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  sink.raw_.sink_ = &out;
  sink.pos_ = sink.buf_;
  sink.raw_.write_ = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  sink.size_ = 0;
  local_4a0.arg_context_.pack_.ptr_ = (pointer)format.size_;
  local_4a0.arg_context_.pack_.len_ = (size_type)args.ptr_;
  local_460.data_ = this;
  if ((void *)local_460.size_ == (void *)0xffffffffffffffff) {
    pPVar4 = UntypedFormatSpecImpl::parsed_conversion(&local_460);
    pFVar6 = &sink;
    pcVar5 = (pPVar4->data_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    pCVar1 = (pPVar4->items_).
             super__Vector_base<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar11 = (char *)0x0;
    sVar7 = extraout_RDX_01;
    pcVar10 = pcVar5;
    local_4a0.converter_.sink_ = pFVar6;
    for (pCVar9 = (pPVar4->items_).
                  super__Vector_base<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar1; pCVar9 = pCVar9 + 1)
    {
      pcVar10 = pcVar10 + (long)pcVar11;
      pcVar11 = pcVar5 + (pCVar9->text_end - (long)pcVar10);
      if (pCVar9->is_conversion == true) {
        conv_string_01._M_str = (char *)pFVar6;
        conv_string_01._M_len = sVar7;
        bVar2 = anon_unknown_3::
                ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                ::ConvertOne(&local_4a0,&pCVar9->conv,conv_string_01);
        sVar7 = extraout_RDX_02;
        if (!bVar2) goto LAB_0010d894;
      }
      else {
        sVar12._M_str = pcVar10;
        sVar12._M_len = (size_t)pcVar11;
        FormatSinkImpl::Append(local_4a0.converter_.sink_,sVar12);
        sVar7 = extraout_RDX_03;
      }
    }
    if (pPVar4->has_error_ == false) {
LAB_0010d8c9:
      FormatSinkImpl::~FormatSinkImpl(&sink);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p == &out.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = out.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = out._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = out._M_string_length;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      out._M_dataplus._M_p = (pointer)&out.field_2;
      goto LAB_0010d91b;
    }
  }
  else {
    sVar12 = UntypedFormatSpecImpl::str(&local_460);
    pbVar8 = (byte *)sVar12._M_str;
    local_4a0.converter_.sink_ = &sink;
    next_arg = 0;
    end = pbVar8 + sVar12._M_len;
    while( true ) {
      if (pbVar8 == end) goto LAB_0010d8c9;
      pvVar3 = memchr(pbVar8,0x25,(long)end - (long)pbVar8);
      if (pvVar3 == (void *)0x0) {
        v_01._M_str = (char *)pbVar8;
        v_01._M_len = (long)end - (long)pbVar8;
        FormatSinkImpl::Append(local_4a0.converter_.sink_,v_01);
        goto LAB_0010d8c9;
      }
      v._M_len = (long)pvVar3 - (long)pbVar8;
      v._M_str = (char *)pbVar8;
      FormatSinkImpl::Append(local_4a0.converter_.sink_,v);
      pbVar8 = (byte *)((long)pvVar3 + 1);
      if (end <= pbVar8) break;
      tag.tag_ = ConvTagHolder::value[*pbVar8].tag_;
      pcVar5 = (char *)CONCAT71(0x1144,tag.tag_);
      if ((char)tag.tag_ < '\0') {
        if (*pbVar8 == 0x25) {
          v_00._M_str = "%";
          v_00._M_len = 1;
          FormatSinkImpl::Append(local_4a0.converter_.sink_,v_00);
          goto LAB_0010d7c8;
        }
        conv.width.value_ = -1;
        conv.precision.value_ = -1;
        conv.flags = kBasic;
        conv.length_mod = none;
        conv.conv = 0x13;
        next_arg_00 = &next_arg;
        pbVar8 = (byte *)ConsumeUnboundConversionNoInline
                                   ((char *)pbVar8,(char *)end,&conv,next_arg_00);
        if ((pbVar8 == (byte *)0x0) ||
           (conv_string_00._M_str = (char *)next_arg_00, conv_string_00._M_len = extraout_RDX_00,
           bVar2 = anon_unknown_3::
                   ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                   ::ConvertOne(&local_4a0,&conv,conv_string_00), !bVar2)) break;
      }
      else {
        if (next_arg < 0) break;
        conv.width.value_ = -1;
        conv.precision.value_ = -1;
        conv.flags = kBasic;
        conv.length_mod = none;
        conv.conv = 0x13;
        conv.conv = ConvTag::as_conv(&tag);
        next_arg = next_arg + 1;
        conv_string._M_str = pcVar5;
        conv_string._M_len = extraout_RDX;
        conv.arg_position = next_arg;
        bVar2 = anon_unknown_3::
                ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                ::ConvertOne(&local_4a0,&conv,conv_string);
        if (!bVar2) break;
LAB_0010d7c8:
        pbVar8 = (byte *)((long)pvVar3 + 2);
      }
    }
  }
LAB_0010d894:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_4a0);
  FormatSinkImpl::~FormatSinkImpl(&sink);
LAB_0010d91b:
  std::__cxx11::string::~string((string *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Summarize(const UntypedFormatSpecImpl format,
                      absl::Span<const FormatArgImpl> args) {
  typedef SummarizingConverter Converter;
  std::string out;
  {
    // inner block to destroy sink before returning out. It ensures a last
    // flush.
    FormatSinkImpl sink(&out);
    if (!ConvertAll(format, args, Converter(&sink))) {
      return "";
    }
  }
  return out;
}